

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O3

int detect_form(archive_read *a,int *is_form_d)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  byte *b;
  ulong uVar5;
  void *pvVar6;
  void *pvVar7;
  ssize_t sVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  byte bVar12;
  ulong uVar13;
  ulong uVar14;
  byte *p;
  byte *pbVar15;
  ulong uVar16;
  ssize_t avail;
  ssize_t nl;
  int local_68;
  int local_64;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  archive_read *local_48;
  ulong local_40;
  int *local_38;
  
  if (is_form_d != (int *)0x0) {
    *is_form_d = 0;
  }
  local_48 = a;
  b = (byte *)__archive_read_ahead(a,1,(ssize_t *)&local_60);
  if (b == (byte *)0x0) {
    iVar4 = -1;
  }
  else {
    local_68 = 0;
    iVar4 = 0;
    local_64 = 0;
    uVar13 = local_60;
    local_38 = is_form_d;
LAB_00574f52:
    local_58 = CONCAT44(local_58._4_4_,iVar4);
LAB_00574f5c:
    uVar16 = local_60;
    if (local_60 == 0) {
      local_50 = 0;
      uVar5 = 0;
LAB_00574f92:
      uVar14 = uVar16;
      uVar9 = uVar13;
      if (uVar5 != uVar16) goto LAB_005753fe;
      while( true ) {
        uVar13 = (ulong)((int)uVar9 + 0x3ffU & 0xfffffc00);
        pvVar6 = __archive_read_ahead
                           (local_48,uVar13 << (uVar13 < uVar9 + 0xa0),(ssize_t *)&local_60);
        pvVar7 = pvVar6;
        if (pvVar6 == (void *)0x0) {
          if ((long)local_60 <= (long)uVar9) {
            uVar5 = 0;
            goto LAB_005753fe;
          }
          pvVar7 = __archive_read_ahead(local_48,local_60,(ssize_t *)&local_60);
        }
        uVar13 = local_60;
        uVar16 = local_60 - (uVar9 - uVar14);
        local_60 = uVar16;
        sVar8 = get_line_size((char *)(uVar9 + (long)pvVar7),uVar16 - uVar14,(ssize_t *)&local_50);
        uVar5 = 0;
        if (-1 < sVar8) {
          uVar5 = uVar14;
        }
        uVar5 = uVar5 + sVar8;
        if (local_50 != 0) break;
        if ((pvVar6 == (void *)0x0) || (uVar14 = uVar16, uVar9 = uVar13, uVar5 != uVar16))
        goto LAB_005753fe;
      }
      b = (byte *)((long)pvVar7 + (uVar9 - uVar14));
    }
    else {
      uVar5 = get_line_size((char *)b,local_60,(ssize_t *)&local_50);
      if (local_50 == 0) goto LAB_00574f92;
    }
    uVar14 = local_50;
    if ((long)uVar5 < 1) goto LAB_005753fe;
    if ((int)local_58 != 0) {
      iVar4 = bid_keyword_list((char *)b,uVar5,0,0);
      if (iVar4 < 1) {
        uVar5 = 1;
        goto LAB_005753fe;
      }
      b = b + uVar5;
      iVar4 = (int)local_58;
      if ((b[~uVar14] != 0x5c) && (iVar4 = 0, (int)local_58 == 1)) {
        if (1 < local_68) goto LAB_00575410;
        local_68 = local_68 + 1;
        iVar4 = 0;
      }
      local_60 = uVar16 - uVar5;
      local_58 = CONCAT44(local_58._4_4_,iVar4);
      goto LAB_00574f5c;
    }
    pbVar15 = b + uVar5;
    do {
      bVar12 = *b;
      if ((bVar12 != 0x20) && (bVar12 != 9)) {
        bVar3 = true;
        goto LAB_0057509c;
      }
      b = b + 1;
      uVar16 = uVar16 - 1;
      bVar3 = 1 < (long)uVar5;
      uVar5 = uVar5 - 1;
      local_60 = uVar16;
    } while (bVar3);
    bVar12 = *pbVar15;
    uVar5 = 0;
    bVar3 = false;
    b = pbVar15;
LAB_0057509c:
    uVar9 = (ulong)bVar12;
    if (bVar12 < 0x23) {
      if ((bVar12 != 10) && (bVar12 != 0xd)) goto LAB_005751a8;
LAB_005750b8:
      b = b + uVar5;
      local_60 = uVar16 - uVar5;
      goto LAB_00574f5c;
    }
    if (bVar12 == 0x23) goto LAB_005750b8;
    if (bVar12 == 0x2f) {
      if (uVar5 < 5) goto LAB_005753fe;
      local_40 = uVar13;
      iVar4 = strncmp((char *)b,"/set",4);
      if (iVar4 == 0) {
        pbVar15 = b + 4;
        lVar11 = uVar5 - 4;
        iVar4 = 0;
LAB_005752c8:
        iVar4 = bid_keyword_list((char *)pbVar15,lVar11,iVar4,0);
        if (0 < iVar4) {
          iVar4 = (uint)(b[~uVar14 + uVar5] == 0x5c) * 2;
          goto LAB_005753cd;
        }
      }
      else if ((6 < uVar5) && (iVar4 = strncmp((char *)b,"/unset",6), iVar4 == 0)) {
        pbVar15 = b + 6;
        lVar11 = uVar5 - 6;
        iVar4 = 1;
        goto LAB_005752c8;
      }
      uVar5 = 1;
      goto LAB_005753fe;
    }
LAB_005751a8:
    pbVar15 = b + uVar5;
    if (bVar3) {
      pcVar1 = bid_entry_safe_char + uVar9;
      p = b;
      uVar14 = uVar5;
      cVar2 = *pcVar1;
      while (cVar2 != '\0') {
        p = p + 1;
        uVar14 = uVar14 - 1;
        if (pbVar15 <= p) goto LAB_005752ff;
        uVar9 = (ulong)*p;
        cVar2 = bid_entry_safe_char[uVar9];
      }
      if (((0x20 < (byte)uVar9) || ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0)) || (*pcVar1 == '\0')
         ) goto LAB_00575219;
      uVar14 = (long)pbVar15 - (long)p;
LAB_005752ff:
      iVar4 = 0;
      bVar3 = true;
LAB_00575348:
      local_58 = local_50;
      iVar4 = bid_keyword_list((char *)p,uVar14,0,iVar4);
      if (iVar4 < 0) goto LAB_005753fe;
      if (local_64 != 1) {
        if (local_64 != 0) goto LAB_0057539f;
        local_64 = 1;
        if (bVar3) {
          local_64 = -(uint)(iVar4 != 0);
          goto LAB_005753a9;
        }
        goto LAB_005753be;
      }
      if ((bool)(bVar3 & iVar4 != 0)) {
        local_64 = 1;
        goto LAB_005753fe;
      }
LAB_0057539f:
      if (bVar3) {
LAB_005753a9:
        iVar4 = 1;
        local_40 = uVar13;
        if (pbVar15[~local_58] != 0x5c) goto LAB_005753be;
      }
      else {
LAB_005753be:
        if (1 < local_68) goto LAB_00575410;
        local_68 = local_68 + 1;
        iVar4 = 0;
        local_40 = uVar13;
      }
LAB_005753cd:
      b = b + uVar5;
      local_60 = uVar16 - uVar5;
      uVar13 = local_40;
      goto LAB_00574f52;
    }
LAB_00575219:
    lVar11 = -local_50;
    if ((((pbVar15 + lVar11 + -2 < b) || (pbVar15[lVar11 + -1] != 0x5c)) ||
        ((bVar12 = pbVar15[lVar11 + -2], bVar12 != 9 && (bVar12 != 0x20)))) &&
       ((b <= pbVar15 + lVar11 + -1 && (bVar12 = pbVar15[lVar11 + -1], bVar12 != 0x5c)))) {
      lVar11 = uVar5 - local_50;
      bVar3 = false;
      uVar10 = 0;
      while( true ) {
        if ((bVar12 == 9) || (bVar12 == 0x20)) goto LAB_0057530e;
        if (bid_entry_safe_char[bVar12] == '\0') goto LAB_005753fe;
        if (bVar12 == 0x2f) {
          bVar3 = true;
        }
        if (b + lVar11 + -2 < b) break;
        bVar12 = b[lVar11 + -2];
        lVar11 = lVar11 + -1;
        uVar10 = uVar10 + 1;
      }
      lVar11 = lVar11 + -1;
      uVar10 = uVar10 + 1;
LAB_0057530e:
      if (((uVar10 != 0) && (bVar3)) && (b[lVar11] != 0x2f)) {
        uVar14 = uVar5 - (uVar10 + local_50);
        iVar4 = 1;
        bVar3 = false;
        p = b;
        goto LAB_00575348;
      }
    }
LAB_005753fe:
    if (local_68 < 3) {
      if (local_68 < 1) {
        return 0;
      }
      if (uVar5 != 0) {
        return 0;
      }
    }
LAB_00575410:
    iVar4 = 0x20;
    if ((local_38 != (int *)0x0) && (local_64 == 1)) {
      *local_38 = 1;
    }
  }
  return iVar4;
}

Assistant:

static int
detect_form(struct archive_read *a, int *is_form_d)
{
	const char *p;
	ssize_t avail, ravail;
	ssize_t detected_bytes = 0, len, nl;
	int entry_cnt = 0, multiline = 0;
	int form_D = 0;/* The archive is generated by `NetBSD mtree -D'
			* (In this source we call it `form D') . */

	if (is_form_d != NULL)
		*is_form_d = 0;
	p = __archive_read_ahead(a, 1, &avail);
	if (p == NULL)
		return (-1);
	ravail = avail;
	for (;;) {
		len = next_line(a, &p, &avail, &ravail, &nl);
		/* The terminal character of the line should be
		 * a new line character, '\r\n' or '\n'. */
		if (len <= 0 || nl == 0)
			break;
		if (!multiline) {
			/* Leading whitespace is never significant,
			 * ignore it. */
			while (len > 0 && (*p == ' ' || *p == '\t')) {
				++p;
				--avail;
				--len;
			}
			/* Skip comment or empty line. */ 
			if (p[0] == '#' || p[0] == '\n' || p[0] == '\r') {
				p += len;
				avail -= len;
				continue;
			}
		} else {
			/* A continuance line; the terminal
			 * character of previous line was '\' character. */
			if (bid_keyword_list(p, len, 0, 0) <= 0)
				break;
			if (multiline == 1)
				detected_bytes += len;
			if (p[len-nl-1] != '\\') {
				if (multiline == 1 &&
				    ++entry_cnt >= MAX_BID_ENTRY)
					break;
				multiline = 0;
			}
			p += len;
			avail -= len;
			continue;
		}
		if (p[0] != '/') {
			int last_is_path, keywords;

			keywords = bid_entry(p, len, nl, &last_is_path);
			if (keywords >= 0) {
				detected_bytes += len;
				if (form_D == 0) {
					if (last_is_path)
						form_D = 1;
					else if (keywords > 0)
						/* This line is not `form D'. */
						form_D = -1;
				} else if (form_D == 1) {
					if (!last_is_path && keywords > 0)
						/* This this is not `form D'
						 * and We cannot accept mixed
						 * format. */
						break;
				}
				if (!last_is_path && p[len-nl-1] == '\\')
					/* This line continues. */
					multiline = 1;
				else {
					/* We've got plenty of correct lines
					 * to assume that this file is a mtree
					 * format. */
					if (++entry_cnt >= MAX_BID_ENTRY)
						break;
				}
			} else
				break;
		} else if (len > 4 && strncmp(p, "/set", 4) == 0) {
			if (bid_keyword_list(p+4, len-4, 0, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else if (len > 6 && strncmp(p, "/unset", 6) == 0) {
			if (bid_keyword_list(p+6, len-6, 1, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else
			break;

		/* Test next line. */
		p += len;
		avail -= len;
	}
	if (entry_cnt >= MAX_BID_ENTRY || (entry_cnt > 0 && len == 0)) {
		if (is_form_d != NULL) {
			if (form_D == 1)
				*is_form_d = 1;
		}
		return (32);
	}

	return (0);
}